

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

void MPLSParser::composeExtensionData
               (BitStreamWriter *writer,
               vector<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_> *extDataBlockInfo)

{
  uint *puVar1;
  uint *puVar2;
  pointer pEVar3;
  byte *pbVar4;
  uint uVar5;
  uint32_t uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  uint i;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  uchar *j;
  byte *pbVar14;
  vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> extDataStartAddrPos;
  
  extDataStartAddrPos.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  extDataStartAddrPos.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  extDataStartAddrPos.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::resize
            (&extDataStartAddrPos,
             (long)(extDataBlockInfo->
                   super__Vector_base<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(extDataBlockInfo->
                   super__Vector_base<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 5);
  puVar1 = (writer->super_BitStream).m_initBuffer;
  iVar7 = *(int *)&(writer->super_BitStream).m_buffer;
  uVar5 = writer->m_bitWrited;
  BitStreamWriter::putBits(writer,0x20,0);
  lVar9 = (long)((int)((iVar7 - (int)puVar1) * 8 + uVar5) / 8);
  iVar10 = (int)((*(int *)&(writer->super_BitStream).m_buffer -
                 *(int *)&(writer->super_BitStream).m_initBuffer) * 8 + writer->m_bitWrited) / 8;
  iVar7 = iVar10;
  if ((extDataBlockInfo->super__Vector_base<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (extDataBlockInfo->super__Vector_base<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    BitStreamWriter::putBits(writer,0x20,0);
    BitStreamWriter::putBits(writer,0x18,0);
    uVar11 = (ulong)((long)(extDataBlockInfo->
                           super__Vector_base<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(extDataBlockInfo->
                          super__Vector_base<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>).
                          _M_impl.super__Vector_impl_data._M_start) >> 5;
    BitStreamWriter::putBits(writer,8,(uint)uVar11);
    uVar11 = uVar11 & 0xffffffff;
    for (lVar12 = 0; uVar11 * 8 - lVar12 != 0; lVar12 = lVar12 + 8) {
      BitStreamWriter::putBits
                (writer,0x10,
                 (&((extDataBlockInfo->
                    super__Vector_base<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>)._M_impl
                    .super__Vector_impl_data._M_start)->id1)[lVar12]);
      BitStreamWriter::putBits
                (writer,0x10,
                 (&((extDataBlockInfo->
                    super__Vector_base<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>)._M_impl
                    .super__Vector_impl_data._M_start)->id2)[lVar12]);
      puVar2 = (writer->super_BitStream).m_initBuffer;
      *(long *)((long)extDataStartAddrPos.
                      super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar12) =
           (long)((int)((*(int *)&(writer->super_BitStream).m_buffer - (int)puVar2) * 8 +
                       writer->m_bitWrited) / 8) + (long)puVar2;
      BitStreamWriter::putBits(writer,0x20,0);
      pEVar3 = (extDataBlockInfo->
               super__Vector_base<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>)._M_impl.
               super__Vector_impl_data._M_start;
      BitStreamWriter::putBits
                (writer,0x20,
                 *(int *)((long)&(pEVar3->data).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl + lVar12 * 4 + 8) -
                 *(int *)((long)&(pEVar3->data).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl + lVar12 * 4));
    }
    while (uVar5 = (int)((*(int *)&(writer->super_BitStream).m_buffer -
                         *(int *)&(writer->super_BitStream).m_initBuffer) * 8 + writer->m_bitWrited)
                   / 8 - iVar10, (uVar5 & 3) != 0) {
      BitStreamWriter::putBits(writer,0x10,0);
    }
    uVar6 = my_ntohl(uVar5 + 4);
    *(uint32_t *)((long)puVar1 + lVar9 + 4) = uVar6;
    uVar13 = 0;
    while( true ) {
      iVar7 = (int)(writer->super_BitStream).m_buffer;
      iVar8 = (int)(writer->super_BitStream).m_initBuffer;
      if (uVar13 == uVar11) break;
      uVar6 = my_ntohl(((int)((iVar7 - iVar8) * 8 + writer->m_bitWrited) / 8 - iVar10) + 4);
      *extDataStartAddrPos.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
       _M_impl.super__Vector_impl_data._M_start[uVar13] = uVar6;
      pEVar3 = (extDataBlockInfo->
               super__Vector_base<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pbVar4 = *(pointer *)
                ((long)&pEVar3[uVar13].data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
                8);
      for (pbVar14 = *(byte **)&pEVar3[uVar13].data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl; pbVar14 != pbVar4; pbVar14 = pbVar14 + 1) {
        BitStreamWriter::putBits(writer,8,(uint)*pbVar14);
      }
      uVar13 = uVar13 + 1;
    }
    iVar7 = (int)((iVar7 - iVar8) * 8 + writer->m_bitWrited) / 8;
  }
  uVar6 = my_ntohl(iVar7 - iVar10);
  *(uint32_t *)((long)puVar1 + lVar9) = uVar6;
  std::_Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>::~_Vector_base
            (&extDataStartAddrPos.
              super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>);
  return;
}

Assistant:

void MPLSParser::composeExtensionData(BitStreamWriter& writer, const vector<ExtDataBlockInfo>& extDataBlockInfo)
{
    vector<uint32_t*> extDataStartAddrPos;
    extDataStartAddrPos.resize(extDataBlockInfo.size());
    const auto lengthPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // length
    const int initPos = writer.getBitsCount() / 8;
    if (!extDataBlockInfo.empty())
    {
        writer.putBits(32, 0);  // data_block_start_address
        writer.putBits(24, 0);  // reserved_for_word_align
        const auto extDataBlockInfoSize = static_cast<unsigned>(extDataBlockInfo.size());
        writer.putBits(8, extDataBlockInfoSize);
        for (unsigned i = 0; i < extDataBlockInfoSize; ++i)
        {
            writer.putBits(16, extDataBlockInfo[i].id1);
            writer.putBits(16, extDataBlockInfo[i].id2);
            extDataStartAddrPos[i] = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
            writer.putBits(32, 0);                                                       // ext_data_start_address
            writer.putBits(32, static_cast<unsigned>(extDataBlockInfo[i].data.size()));  // ext_data_length
        }
        while ((writer.getBitsCount() / 8 - initPos) % 4 != 0) writer.putBits(16, 0);
        *(lengthPos + 1) = my_htonl(writer.getBitsCount() / 8 - initPos + 4);  // data_block_start_address
        for (unsigned i = 0; i < extDataBlockInfoSize; ++i)
        {
            *(extDataStartAddrPos[i]) = my_htonl(writer.getBitsCount() / 8 - initPos + 4);
            for (const auto& j : extDataBlockInfo[i].data) writer.putBits(8, j);
        }
    }

    *lengthPos = my_htonl(writer.getBitsCount() / 8 - initPos);
}